

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Block *b)

{
  bool bVar1;
  pool_ref *this_00;
  Statement *pSVar2;
  pool_ref<soul::AST::Statement> *s;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
  *__range2;
  Block *b_local;
  ASTVisitor *this_local;
  
  __end2 = std::
           vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
           ::begin(&b->statements);
  s = (pool_ref<soul::AST::Statement> *)
      std::
      vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
      ::end(&b->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                                *)&s);
    if (!bVar1) break;
    this_00 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
              ::operator*(&__end2);
    pSVar2 = pool_ref::operator_cast_to_Statement_(this_00);
    (*this->_vptr_ASTVisitor[4])(this,pSVar2);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

virtual void visit (AST::Block& b)
    {
        for (auto& s : b.statements)
            visitObject (s);
    }